

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search_utils.h
# Opt level: O2

int get_hist_bin_idx(int dx,int dy)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  int *piVar4;
  
  iVar1 = (dy << 0x10) / dx;
  if (iVar1 < -0x11a6e) {
    uVar2 = 7;
    uVar3 = 0;
  }
  else if (iVar1 < -0xc79) {
    uVar2 = 0xf;
    uVar3 = 8;
  }
  else {
    uVar2 = (ulong)(0xe821 < iVar1) * 8;
    uVar3 = uVar2 + 0x10;
    uVar2 = uVar2 | 0x17;
  }
  piVar4 = get_hist_bin_idx::thresholds + uVar3;
  while( true ) {
    if (uVar2 < uVar3) {
      return 0x1f;
    }
    if (iVar1 <= *piVar4) break;
    uVar3 = uVar3 + 1;
    piVar4 = piVar4 + 1;
  }
  return (int)uVar3;
}

Assistant:

static inline int get_hist_bin_idx(int dx, int dy) {
  const int32_t ratio = (dy * (1 << FIX_PREC_BITS)) / dx;

  // Find index by bisection
  static const int thresholds[BINS] = {
    -1334015, -441798, -261605, -183158, -138560, -109331, -88359, -72303,
    -59392,   -48579,  -39272,  -30982,  -23445,  -16400,  -9715,  -3194,
    3227,     9748,    16433,   23478,   31015,   39305,   48611,  59425,
    72336,    88392,   109364,  138593,  183191,  261638,  441831, INT32_MAX
  };

  int lo_idx = 0, hi_idx = BINS - 1;
  // Divide into segments of size 8 gives better performance than binary search
  // here.
  if (ratio <= thresholds[7]) {
    lo_idx = 0;
    hi_idx = 7;
  } else if (ratio <= thresholds[15]) {
    lo_idx = 8;
    hi_idx = 15;
  } else if (ratio <= thresholds[23]) {
    lo_idx = 16;
    hi_idx = 23;
  } else {
    lo_idx = 24;
    hi_idx = 31;
  }

  for (int idx = lo_idx; idx <= hi_idx; idx++) {
    if (ratio <= thresholds[idx]) {
      return idx;
    }
  }
  assert(0 && "No valid histogram bin found!");
  return BINS - 1;
}